

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

ShaderResourceBindingVkImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::ShaderResourceBindingVkImpl,Diligent::FixedBlockMemoryAllocator>::
operator()(MakeNewRCObj<Diligent::ShaderResourceBindingVkImpl,Diligent::FixedBlockMemoryAllocator>
           *this,PipelineResourceSignatureVkImpl **CtorArgs)

{
  PipelineResourceSignatureVkImpl **ppPVar1;
  ShaderResourceBindingVkImpl *local_30;
  ShaderResourceBindingVkImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  PipelineResourceSignatureVkImpl **CtorArgs_local;
  MakeNewRCObj<Diligent::ShaderResourceBindingVkImpl,_Diligent::FixedBlockMemoryAllocator>
  *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  ppPVar1 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (ShaderResourceBindingVkImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (ShaderResourceBindingVkImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_30 = (ShaderResourceBindingVkImpl *)
               RefCountedObject<Diligent::IShaderResourceBindingVk>::operator_new
                         ((RefCountedObject<Diligent::IShaderResourceBindingVk> *)0x68,
                          (size_t)ppPVar1);
    ShaderResourceBindingVkImpl::ShaderResourceBindingVkImpl
              (local_30,(IReferenceCounters *)pObj,*CtorArgs);
  }
  else {
    local_30 = (ShaderResourceBindingVkImpl *)
               ::new<Diligent::FixedBlockMemoryAllocator>
                         (0x68,*(FixedBlockMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    ShaderResourceBindingVkImpl::ShaderResourceBindingVkImpl
              (local_30,(IReferenceCounters *)pObj,*CtorArgs);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::
    Attach<Diligent::ShaderResourceBindingVkImpl,Diligent::FixedBlockMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_30,*(FixedBlockMemoryAllocator **)this);
  }
  return local_30;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }